

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ValueInfo.cpp
# Opt level: O0

bool __thiscall
ValueInfo::TryGetIntConstantValue(ValueInfo *this,int64 *intValueRef,bool isUnsigned)

{
  code *pcVar1;
  bool bVar2;
  undefined4 *puVar3;
  _IntConstantValueInfo<long,_Int64ConstantValueInfo,_(ValueStructureKind)2> *this_00;
  long lVar4;
  bool isUnsigned_local;
  int64 *intValueRef_local;
  ValueInfo *this_local;
  
  if (intValueRef == (int64 *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/ValueInfo.cpp"
                       ,0x29,"(intValueRef)","intValueRef");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 0;
  }
  bVar2 = this->structureKind == Int64Constant;
  if (bVar2) {
    this_00 = &AsInt64Constant(this)->
               super__IntConstantValueInfo<long,_Int64ConstantValueInfo,_(ValueStructureKind)2>;
    lVar4 = _IntConstantValueInfo<long,_Int64ConstantValueInfo,_(ValueStructureKind)2>::IntValue
                      (this_00);
    *intValueRef = lVar4;
  }
  return bVar2;
}

Assistant:

bool ValueInfo::TryGetIntConstantValue(int64 *const intValueRef, const bool isUnsigned) const
{
    Assert(intValueRef);
    if (structureKind == ValueStructureKind::Int64Constant)
    {
        *intValueRef = AsInt64Constant()->IntValue();
        return true;
    }
    return false;
}